

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

void __thiscall
QDomNodeListPrivate::QDomNodeListPrivate
          (QDomNodeListPrivate *this,QDomNodePrivate *n_impl,QString *name)

{
  (this->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 1;
  (this->tagname).d.d = (Data *)0x0;
  (this->tagname).d.ptr = (char16_t *)0x0;
  (this->tagname).d.size = 0;
  (this->nsURI).d.d = (Data *)0x0;
  (this->list).d.size = 0;
  (this->nsURI).d.ptr = (char16_t *)0x0;
  (this->nsURI).d.size = 0;
  (this->list).d.d = (Data *)0x0;
  (this->list).d.ptr = (QDomNodePrivate **)0x0;
  this->node_impl = n_impl;
  if (n_impl != (QDomNodePrivate *)0x0) {
    LOCK();
    (n_impl->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (n_impl->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QString::operator=(&this->tagname,name);
  this->timestamp = 0;
  return;
}

Assistant:

QDomNodeListPrivate::QDomNodeListPrivate(QDomNodePrivate *n_impl, const QString &name) :
    ref(1)
{
    node_impl = n_impl;
    if (node_impl)
        node_impl->ref.ref();
    tagname = name;
    timestamp = 0;
}